

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clip.cpp
# Opt level: O3

void __thiscall
clip_model_loader::get_arr_int
          (clip_model_loader *this,string *key,vector<int,_std::allocator<int>_> *output,
          bool required)

{
  pointer piVar1;
  uint uVar2;
  uint uVar3;
  long lVar4;
  runtime_error *this_00;
  ulong uVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  uVar2 = gguf_find_key((this->ctx_gguf)._M_t.
                        super___uniq_ptr_impl<gguf_context,_gguf_context_deleter>._M_t.
                        super__Tuple_impl<0UL,_gguf_context_*,_gguf_context_deleter>.
                        super__Head_base<0UL,_gguf_context_*,_false>._M_head_impl,
                        (key->_M_dataplus)._M_p);
  if ((int)uVar2 < 0) {
    if (required) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::operator+(&local_50,"Key not found: ",key);
      std::runtime_error::runtime_error(this_00,(string *)&local_50);
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  else {
    uVar3 = gguf_get_arr_n((this->ctx_gguf)._M_t.
                           super___uniq_ptr_impl<gguf_context,_gguf_context_deleter>._M_t.
                           super__Tuple_impl<0UL,_gguf_context_*,_gguf_context_deleter>.
                           super__Head_base<0UL,_gguf_context_*,_false>._M_head_impl,
                           uVar2 & 0x7fffffff);
    std::vector<int,_std::allocator<int>_>::resize(output,(long)(int)uVar3);
    lVar4 = gguf_get_arr_data((this->ctx_gguf)._M_t.
                              super___uniq_ptr_impl<gguf_context,_gguf_context_deleter>._M_t.
                              super__Tuple_impl<0UL,_gguf_context_*,_gguf_context_deleter>.
                              super__Head_base<0UL,_gguf_context_*,_false>._M_head_impl,
                              uVar2 & 0x7fffffff);
    if (0 < (int)uVar3) {
      piVar1 = (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar5 = 0;
      do {
        piVar1[uVar5] = *(int *)(lVar4 + uVar5 * 4);
        uVar5 = uVar5 + 1;
      } while ((uVar3 & 0x7fffffff) != uVar5);
    }
  }
  return;
}

Assistant:

void get_arr_int(const std::string & key, std::vector<int> & output, bool required = true) {
        const int i = gguf_find_key(ctx_gguf.get(), key.c_str());
        if (i < 0) {
            if (required) throw std::runtime_error("Key not found: " + key);
            return;
        }
        int n = gguf_get_arr_n(ctx_gguf.get(), i);
        output.resize(n);
        const int32_t * values = (const int32_t *)gguf_get_arr_data(ctx_gguf.get(), i);
        for (int i = 0; i < n; ++i) {
            output[i] = values[i];
        }
    }